

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O1

Action __thiscall
psy::C::TypeChecker::visitPredefinedName(TypeChecker *this,PredefinedNameSyntax *node)

{
  SemanticModel *this_00;
  Action AVar1;
  Compilation *pCVar2;
  Type *pTVar3;
  SyntaxTree *this_01;
  tuple<psy::C::Type_*,_std::default_delete<psy::C::Type>_> this_02;
  ostream *poVar4;
  pointer __p;
  uint uVar5;
  unique_ptr<psy::C::QualifiedType,_std::default_delete<psy::C::QualifiedType>_> qualTy;
  __uniq_ptr_impl<psy::C::Type,_std::default_delete<psy::C::Type>_> local_70;
  _Head_base<0UL,_psy::C::Type_*,_false> local_68;
  _Head_base<0UL,_psy::C::ArrayType_*,_false> local_60;
  SyntaxToken local_58;
  
  SyntaxNode::tokenAtIndex(&local_58,(SyntaxNode *)node,node->identTkIdx_);
  SyntaxToken::~SyntaxToken(&local_58);
  uVar5 = local_58.syntaxK_ - 0x69;
  if (uVar5 < 0x25) {
    if ((0x1e00000000U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
      if ((0x30000001UL >> ((ulong)uVar5 & 0x3f) & 1) == 0) goto LAB_002ec718;
      pCVar2 = SemanticModel::compilation(this->semaModel_);
      pTVar3 = &Compilation::canonicalBasicType(pCVar2,Char)->super_Type;
      this_01 = (SyntaxTree *)operator_new(0x10);
      QualifiedType::QualifiedType((QualifiedType *)this_01,pTVar3);
      local_58.tree_ = this_01;
      QualifiedType::qualifyWithConst((QualifiedType *)this_01);
      local_68._M_head_impl = (Type *)local_58.tree_;
      local_58.tree_ = (SyntaxTree *)0x0;
      pTVar3 = SemanticModel::keepType
                         (this->semaModel_,
                          (unique_ptr<psy::C::Type,_std::default_delete<psy::C::Type>_> *)&local_68)
      ;
      if ((SyntaxTree *)local_68._M_head_impl != (SyntaxTree *)0x0) {
        (*((Type *)&(local_68._M_head_impl)->_vptr_Type)->_vptr_Type[1])();
      }
      local_68._M_head_impl = (Type *)0x0;
      this_00 = this->semaModel_;
      this_02.super__Tuple_impl<0UL,_psy::C::Type_*,_std::default_delete<psy::C::Type>_>.
      super__Head_base<0UL,_psy::C::Type_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_psy::C::Type_*,_std::default_delete<psy::C::Type>_>)operator_new(0x10);
      ArrayType::ArrayType
                ((ArrayType *)
                 this_02.super__Tuple_impl<0UL,_psy::C::Type_*,_std::default_delete<psy::C::Type>_>.
                 super__Head_base<0UL,_psy::C::Type_*,_false>._M_head_impl,pTVar3);
      local_60._M_head_impl = (ArrayType *)0x0;
      local_70._M_t.super__Tuple_impl<0UL,_psy::C::Type_*,_std::default_delete<psy::C::Type>_>.
      super__Head_base<0UL,_psy::C::Type_*,_false>._M_head_impl =
           (tuple<psy::C::Type_*,_std::default_delete<psy::C::Type>_>)
           (tuple<psy::C::Type_*,_std::default_delete<psy::C::Type>_>)
           this_02.super__Tuple_impl<0UL,_psy::C::Type_*,_std::default_delete<psy::C::Type>_>.
           super__Head_base<0UL,_psy::C::Type_*,_false>._M_head_impl;
      pTVar3 = SemanticModel::keepType
                         (this_00,(unique_ptr<psy::C::Type,_std::default_delete<psy::C::Type>_> *)
                                  &local_70);
      this->ty_ = pTVar3;
      if ((_Tuple_impl<0UL,_psy::C::Type_*,_std::default_delete<psy::C::Type>_>)
          local_70._M_t.super__Tuple_impl<0UL,_psy::C::Type_*,_std::default_delete<psy::C::Type>_>.
          super__Head_base<0UL,_psy::C::Type_*,_false>._M_head_impl != (Type *)0x0) {
        (**(code **)(*(long *)local_70._M_t.
                              super__Tuple_impl<0UL,_psy::C::Type_*,_std::default_delete<psy::C::Type>_>
                              .super__Head_base<0UL,_psy::C::Type_*,_false>._M_head_impl + 8))();
      }
      local_70._M_t.super__Tuple_impl<0UL,_psy::C::Type_*,_std::default_delete<psy::C::Type>_>.
      super__Head_base<0UL,_psy::C::Type_*,_false>._M_head_impl =
           (tuple<psy::C::Type_*,_std::default_delete<psy::C::Type>_>)
           (_Tuple_impl<0UL,_psy::C::Type_*,_std::default_delete<psy::C::Type>_>)0x0;
      std::unique_ptr<psy::C::ArrayType,_std::default_delete<psy::C::ArrayType>_>::~unique_ptr
                ((unique_ptr<psy::C::ArrayType,_std::default_delete<psy::C::ArrayType>_> *)&local_60
                );
      std::unique_ptr<psy::C::QualifiedType,_std::default_delete<psy::C::QualifiedType>_>::
      ~unique_ptr((unique_ptr<psy::C::QualifiedType,_std::default_delete<psy::C::QualifiedType>_> *)
                  &local_58);
    }
    else {
      pCVar2 = SemanticModel::compilation(this->semaModel_);
      pTVar3 = &Compilation::canonicalBasicType(pCVar2,Int_S)->super_Type;
      this->ty_ = pTVar3;
    }
    AVar1 = Skip;
  }
  else {
LAB_002ec718:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeChecker.cpp"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x291);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<empty message>",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    AVar1 = Quit;
  }
  return AVar1;
}

Assistant:

SyntaxVisitor::Action TypeChecker::visitPredefinedName(
        const PredefinedNameSyntax* node)
{
    switch (node->identifierToken().kind()) {
        case SyntaxKind::Keyword___func__:
        case SyntaxKind::Keyword_ExtGNU___FUNCTION__:
        case SyntaxKind::Keyword_ExtGNU___PRETTY_FUNCTION__: {
            auto charTy = semaModel_->compilation()->canonicalBasicType(BasicTypeKind::Char);
            std::unique_ptr<QualifiedType> qualTy(new QualifiedType(charTy));
            qualTy->qualifyWithConst();
            auto ty = semaModel_->keepType(std::move(qualTy));
            ty_ = semaModel_->keepType(std::unique_ptr<ArrayType>(new ArrayType(ty)));
            break;
        }
        case SyntaxKind::Keyword_ExtGNU___printf__:
        case SyntaxKind::Keyword_ExtGNU___scanf__:
        case SyntaxKind::Keyword_ExtGNU___strftime__:
        case SyntaxKind::Keyword_ExtGNU___strfmon__:
            ty_ = semaModel_->compilation()->canonicalBasicType(BasicTypeKind::Int_S);
            break;
        default:
            PSY_ASSERT_1(false);
            return Action::Quit;
    }

    return Action::Skip;
}